

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O3

word Gia_LutComputeTruth6(Gia_Man_t *p,int iObj,Vec_Wrd_t *vTruths)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  word wVar4;
  word *pwVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  
  if (-1 < iObj) {
    if (iObj < p->vMapping->nSize) {
      if (p->vMapping->pArray[(uint)iObj] == 0) {
        __assert_fail("Gia_ObjIsLut(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaTruth.c"
                      ,0x111,"word Gia_LutComputeTruth6(Gia_Man_t *, int, Vec_Wrd_t *)");
      }
      Gia_ManIncrementTravId(p);
      pVVar2 = p->vMapping;
      uVar7 = pVVar2->nSize;
      if (iObj < (int)uVar7) {
        piVar3 = pVVar2->pArray;
        pwVar5 = s_Truths6;
        lVar6 = 0;
        do {
          lVar8 = (long)piVar3[(uint)iObj];
          if ((lVar8 < 0) || (uVar7 <= (uint)piVar3[(uint)iObj])) break;
          if (piVar3[lVar8] <= lVar6) {
            wVar4 = Gia_LutComputeTruth6_rec(p,iObj,vTruths);
            return wVar4;
          }
          iVar1 = piVar3[lVar8 + lVar6 + 1];
          lVar8 = (long)iVar1;
          if ((lVar8 < 0) || (vTruths->nSize <= iVar1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                          ,0x1cf,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
          }
          vTruths->pArray[lVar8] = *pwVar5;
          if (p->nTravIdsAlloc <= iVar1) {
            __assert_fail("Id < p->nTravIdsAlloc",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
          }
          p->pTravIds[lVar8] = p->nTravIds;
          lVar6 = lVar6 + 1;
          uVar7 = pVVar2->nSize;
          pwVar5 = pwVar5 + 1;
        } while (iObj < (int)uVar7);
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

word Gia_LutComputeTruth6( Gia_Man_t * p, int iObj, Vec_Wrd_t * vTruths )
{
    int k, iFan;
    assert( Gia_ObjIsLut(p, iObj) );
    Gia_ManIncrementTravId( p );
    Gia_LutForEachFanin( p, iObj, iFan, k )
    {
        Vec_WrdWriteEntry( vTruths, iFan, s_Truths6[k] );
        Gia_ObjSetTravIdCurrentId( p, iFan );
    }
    return Gia_LutComputeTruth6_rec( p, iObj, vTruths );
}